

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteCxxModuleLibraryStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *param_2,bool firstForConfig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *this_00;
  cmGlobalNinjaGenerator *pcVar2;
  mapped_type *pmVar3;
  cmGeneratedFileStream *os;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmNinjaBuild build;
  string local_1e0;
  char *local_1c0;
  size_type local_1b8;
  char local_1b0 [8];
  undefined8 uStack_1a8;
  string local_1a0;
  string local_180;
  pointer local_160;
  string *local_158;
  undefined1 local_150 [216];
  _Rb_tree_node_base local_78;
  size_t local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"phony","");
  local_150._0_8_ = local_150 + 0x10;
  local_150._8_8_ = 0;
  local_150[0x10] = '\0';
  local_150._32_8_ = local_150 + 0x30;
  if (local_1c0 == local_1b0) {
    local_150._56_8_ = uStack_1a8;
  }
  else {
    local_150._32_8_ = local_1c0;
  }
  local_150._40_8_ = local_1b8;
  local_1b8 = 0;
  local_1b0[0] = '\0';
  local_78._M_color = _S_red;
  local_78._M_parent = (_Base_ptr)0x0;
  local_1c0 = local_1b0;
  memset((cmNinjaDeps *)(local_150 + 0x40),0,0x90);
  local_58 = 0;
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_78._M_left = &local_78;
  local_78._M_right = &local_78;
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_1a0,&this->super_cmNinjaTargetGenerator);
  local_180._M_dataplus._M_p = &DAT_0000001c;
  local_180._M_string_length = 0x8485c7;
  local_180.field_2._M_allocated_capacity = 0;
  local_180.field_2._8_8_ = local_1a0._M_string_length;
  local_160 = local_1a0._M_dataplus._M_p;
  views._M_len = 2;
  views._M_array = (iterator)&local_180;
  local_158 = &local_1a0;
  cmCatViews(&local_1e0,views);
  std::__cxx11::string::operator=((string *)local_150,(string *)&local_1e0);
  paVar1 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  cmLocalNinjaGenerator::AppendTargetOutputs
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             (cmNinjaDeps *)(local_150 + 0x40),config);
  if (firstForConfig) {
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    this_00 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    pcVar2 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
             ::operator[](&pcVar2->Configs,config);
    cmLocalNinjaGenerator::AppendTargetOutputs
              (this_00,target,&pmVar3->ByproductsForCleanTarget,config);
  }
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"CXX","");
  cmNinjaTargetGenerator::GetDyndepFilePath
            (&local_180,&this->super_cmNinjaTargetGenerator,&local_1e0,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_150 + 0x88)
             ,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(pcVar2,(ostream *)os,(cmNinjaBuild *)local_150,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_150);
  pcVar2 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)local_150,&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias
            (pcVar2,(string *)local_150,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
    operator_delete((void *)local_150._0_8_,CONCAT71(local_150._17_7_,local_150[0x10]) + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteCxxModuleLibraryStatement(
  const std::string& config, const std::string& /*fileConfig*/,
  bool firstForConfig)
{
  // TODO: How to use `fileConfig` properly?

  // Write a phony output that depends on the scanning output.
  {
    cmNinjaBuild build("phony");
    build.Comment =
      cmStrCat("Imported C++ module library ", this->GetTargetName());
    this->GetLocalGenerator()->AppendTargetOutputs(this->GetGeneratorTarget(),
                                                   build.Outputs, config);
    if (firstForConfig) {
      this->GetLocalGenerator()->AppendTargetOutputs(
        this->GetGeneratorTarget(),
        this->GetGlobalGenerator()->GetByproductsForCleanTarget(config),
        config);
    }
    build.ExplicitDeps.emplace_back(this->GetDyndepFilePath("CXX", config));
    this->GetGlobalGenerator()->WriteBuild(this->GetCommonFileStream(), build);
  }

  // Add aliases for the target name.
  this->GetGlobalGenerator()->AddTargetAlias(
    this->GetTargetName(), this->GetGeneratorTarget(), config);
}